

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O1

int dump(Options *opts,string *name)

{
  ostream *poVar1;
  istream *piVar2;
  long *plVar3;
  RiceCompressionHeader RVar4;
  tm *__tp;
  size_t sVar5;
  char *pcVar6;
  pointer puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _func_int **pp_Var10;
  bool bVar11;
  ImageStructureHeader IVar12;
  TimeStampHeader TVar13;
  PrimaryHeader h;
  string line;
  timespec ts;
  File file;
  string type;
  undefined1 local_2b8 [14];
  byte bStack_2aa;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  TimeStampHeader local_298;
  undefined4 uStack_28c;
  char local_288;
  undefined7 uStack_287;
  _Rb_tree_node_base *local_278;
  timespec local_270;
  long local_260 [2];
  Options *local_250;
  File local_248;
  undefined1 local_1b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  undefined8 uVar8;
  
  local_250 = opts;
  lrit::File::File(&local_248,name);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  bVar11 = (_Rb_tree_header *)local_248.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_248.m_._M_t._M_impl.super__Rb_tree_header;
  if (bVar11) {
    do {
      pp_Var10 = (_func_int **)(local_1b0 + 0x10);
      local_278 = local_248.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      switch(local_248.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color) {
      case _S_red:
        lrit::getHeader<lrit::PrimaryHeader>
                  ((PrimaryHeader *)local_2b8,&local_248.header_,&local_248.m_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Primary (",9);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        local_1b0._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1b0[0x10] = 0;
        pcVar6 = "unknown";
        if ((ulong)local_2b8[4] < 5) {
          pcVar6 = &DAT_00121038 + *(int *)(&DAT_00121038 + (ulong)local_2b8[4] * 4);
        }
        local_1b0._0_8_ = pp_Var10;
        std::__cxx11::string::_M_replace((ulong)local_1b0,0,(char *)0x0,(ulong)pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  File type: ",0xd);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)local_2b8[4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(char *)local_1b0._0_8_,local_1b0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Header header length (bits/bytes): ",0x25);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Data length (bits/bytes): ",0x1c);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Total length (bits/bytes): ",0x1d);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
        }
        break;
      case _S_black:
        IVar12 = lrit::getHeader<lrit::ImageStructureHeader>(&local_248.header_,&local_248.m_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Image structure (",0x11);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Bits per pixel: ",0x12);
        plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,IVar12._4_4_ & 0xff);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Columns: ",0xb);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Lines: ",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Compression: ",0xf);
        plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,IVar12._8_4_ >> 0x10 & 0xff)
        ;
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        break;
      case 2:
        lrit::getHeader<lrit::ImageNavigationHeader>
                  ((ImageNavigationHeader *)local_1b0,&local_248.header_,&local_248.m_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Image navigation (",0x12);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Projection name: ",0x13);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1b0._8_8_,
                            CONCAT71(local_1b0._17_7_,local_1b0[0x10]));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Column scaling: ",0x12);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Line scaling: ",0x10);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Column offset: ",0x11);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Line offset: ",0xf);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        goto LAB_00111b93;
      case 3:
        lrit::getHeader<lrit::ImageDataFunctionHeader>
                  ((ImageDataFunctionHeader *)local_2b8,&local_248.header_,&local_248.m_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Image data function (",0x15);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Data: ",8);
        if (local_250->verbose == true) {
          local_270.tv_sec = (__time_t)local_260;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,stack0xfffffffffffffd50,local_2a8._M_allocated_capacity);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b0,(string *)&local_270,_S_in);
          local_298._0_8_ = &local_288;
          local_298.ccsds[4] = '\0';
          local_298.ccsds[5] = '\0';
          local_298.ccsds[6] = '\0';
          local_298._11_1_ = 0;
          uStack_28c = 0;
          local_288 = '\0';
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_1b0,(string *)&local_298,'\n'),
                ((&piVar2->field_0x20)[(long)piVar2->_vptr_basic_istream[-3]] & 5) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
            poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_298._0_8_,
                                CONCAT44(uStack_28c,local_298._8_4_));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
            std::ostream::put((char)poVar1);
            std::ostream::flush();
          }
          if ((char *)local_298._0_8_ != &local_288) {
            operator_delete((void *)local_298._0_8_,CONCAT71(uStack_287,local_288) + 1);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
          std::ios_base::~ios_base(local_138);
          if ((long *)local_270.tv_sec != local_260) {
            operator_delete((void *)local_270.tv_sec,local_260[0] + 1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"(omitted, length: ",0x12);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
        }
        if (stack0xfffffffffffffd50 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) break;
        puVar7 = (pointer)(local_2a8._8_8_ - (long)stack0xfffffffffffffd50);
        paVar9 = stack0xfffffffffffffd50;
        goto LAB_00111bb3;
      case 4:
        lrit::getHeader<lrit::AnnotationHeader>
                  ((AnnotationHeader *)local_1b0,&local_248.header_,&local_248.m_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Annotation (",0xc)
        ;
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Text: ",8);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1b0._8_8_,
                            CONCAT71(local_1b0._17_7_,local_1b0[0x10]));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        goto LAB_00111b93;
      case 5:
        TVar13 = lrit::getHeader<lrit::TimeStampHeader>(&local_248.header_,&local_248.m_);
        local_298._0_8_ = TVar13._0_8_;
        local_298._8_4_ = TVar13._8_4_;
        local_270 = lrit::TimeStampHeader::getUnix(&local_298);
        __tp = gmtime(&local_270.tv_sec);
        sVar5 = strftime(local_1b0,0x80,"%Y-%m-%d %H:%M:%S",__tp);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time stamp (",0xc)
        ;
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Time stamp: ",0xe);
        local_2b8._0_8_ = &local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,local_1b0,local_1b0 + sVar5);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_2b8._0_8_,
                            (long)stack0xfffffffffffffd50);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        uVar8 = local_2a8._M_allocated_capacity;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2b8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ == &local_2a8) break;
        goto LAB_00111bb0;
      case 6:
        lrit::getHeader<lrit::AncillaryTextHeader>
                  ((AncillaryTextHeader *)local_1b0,&local_248.header_,&local_248.m_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Ancillary text (",0x10);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Text: ",8);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1b0._8_8_,
                            CONCAT71(local_1b0._17_7_,local_1b0[0x10]));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
LAB_00111b93:
        uVar8 = local_198[0]._M_allocated_capacity;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1b0._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._8_8_ != local_198) {
LAB_00111bb0:
          puVar7 = (pointer)(uVar8 + 1);
LAB_00111bb3:
          operator_delete(paVar9,(ulong)puVar7);
        }
        break;
      default:
        switch(local_248.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color) {
        case 0x80:
          lrit::getHeader<lrit::SegmentIdentificationHeader>
                    ((SegmentIdentificationHeader *)local_1b0,&local_248.header_,&local_248.m_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Segment identification (",0x18);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Image identifier: ",0x14);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Segment number: ",0x12);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Start column of segment: ",0x1b);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Start line of segment: ",0x19);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Number of segments: ",0x16);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Width of final image: ",0x18);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Height of final image: ",0x19);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          break;
        case 0x81:
          _local_2b8 = lrit::getHeader<lrit::NOAALRITHeader>(&local_248.header_,&local_248.m_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"NOAA LRIT (",0xb);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x81);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Agency signature: ",0x14);
          pcVar6 = local_2b8 + 4;
          local_1b0._0_8_ = pp_Var10;
          sVar5 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,pcVar6,pcVar6 + sVar5)
          ;
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_1b0._0_8_,local_1b0._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          if ((_func_int **)local_1b0._0_8_ != pp_Var10) {
            operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Product ID: ",0xe);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Product SubID: ",0x11);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Parameter: ",0xd);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  NOAA-specific compression: ",0x1d);
          plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)bStack_2aa);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          break;
        case 0x82:
          break;
        case 0x83:
          RVar4 = lrit::getHeader<lrit::RiceCompressionHeader>(&local_248.header_,&local_248.m_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Rice compression (",0x12);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x83);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Flags: ",9);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Pixels per block: ",0x14);
          plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,RVar4._6_2_ & 0xff);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Scan lines per packet: ",0x19);
          plVar3 = (long *)std::ostream::operator<<
                                     ((ostream *)&std::cout,(uint)RVar4.scanLinesPerPacket);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          break;
        case 0x84:
          lrit::getHeader<lrit::DCSFileNameHeader>
                    ((DCSFileNameHeader *)local_1b0,&local_248.header_,&local_248.m_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"DCS file name (",0xf);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x84);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"):",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  File name: ",0xd);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_1b0._8_8_,
                              CONCAT71(local_1b0._17_7_,local_1b0[0x10]));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          goto LAB_00111b93;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Header ",7);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_278[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," not handled...",0xf);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          goto LAB_00111d20;
        }
      }
      local_248.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_278);
      bVar11 = (_Rb_tree_header *)local_248.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
               != &local_248.m_._M_t._M_impl.super__Rb_tree_header;
    } while (bVar11);
  }
LAB_00111d20:
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_248.m_._M_t);
  if (local_248.header_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.header_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.header_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.header_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.file_._M_dataplus._M_p != &local_248.file_.field_2) {
    operator_delete(local_248.file_._M_dataplus._M_p,
                    local_248.file_.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar11;
}

Assistant:

int dump(const Options& opts, const std::string& name) {
  auto file = lrit::File(name);
  std::cout << name << ":" << std::endl;
  for (const auto& it : file.getHeaderMap()) {
    if (it.first == lrit::PrimaryHeader::CODE) {
      auto h = file.getHeader<lrit::PrimaryHeader>();
      std::cout << "Primary (" << decltype(h)::CODE << "):" << std::endl;

      std::string type;
      switch (h.fileType) {
      case 0:
        type = "Image Data";
        break;
      case 1:
        type = "Service Message";
        break;
      case 2:
        type = "Alphanumeric Text";
        break;
      case 3:
        type = "Meteorological Data";
        break;
      case 4:
        type = "GTS Messages";
        break;
      default:
        type = "unknown";
        break;
      }

      std::cout << "  File type: "
                << int(h.fileType)
                << " (" << type << ")"
                << std::endl;

      // LRIT value is in bytes
      auto headerBits = h.totalHeaderLength * 8;
      auto headerBytes = h.totalHeaderLength;
      std::cout << "  Header header length (bits/bytes): "
                << headerBits
                << "/"
                << headerBytes
                << std::endl;

      // LRIT value is in bits
      auto dataBits = h.dataLength;
      auto dataBytes = h.dataLength / 8;
      std::cout << "  Data length (bits/bytes): "
                << dataBits
                << "/"
                << dataBytes
                << std::endl;

      std::cout << "  Total length (bits/bytes): "
                << (headerBits + dataBits)
                << "/"
                << (headerBytes + dataBytes)
                << std::endl;
    } else if (it.first == lrit::ImageStructureHeader::CODE) {
      auto h = file.getHeader<lrit::ImageStructureHeader>();
      std::cout << "Image structure (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Bits per pixel: "
                << int(h.bitsPerPixel) << std::endl;
      std::cout << "  Columns: "
                << h.columns << std::endl;
      std::cout << "  Lines: "
                << h.lines << std::endl;
      std::cout << "  Compression: "
                << int(h.compression) << std::endl;
    } else if (it.first == lrit::ImageNavigationHeader::CODE) {
      auto h = file.getHeader<lrit::ImageNavigationHeader>();
      std::cout << "Image navigation (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Projection name: "
                << h.projectionName << std::endl;
      std::cout << "  Column scaling: "
                << h.columnScaling << std::endl;
      std::cout << "  Line scaling: "
                << h.lineScaling << std::endl;
      std::cout << "  Column offset: "
                << h.columnOffset << std::endl;
      std::cout << "  Line offset: "
                << h.lineOffset << std::endl;
    } else if (it.first == lrit::ImageDataFunctionHeader::CODE) {
      auto h = file.getHeader<lrit::ImageDataFunctionHeader>();
      std::cout << "Image data function (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Data: ";
      if (opts.verbose) {
        const auto str = std::string((const char*) h.data.data(), h.data.size());
        std::istringstream iss(str);
        std::string line;
        std::cout << std::endl;
        while (std::getline(iss, line, '\n')) {
          std::cout << "    " << line << std::endl;
        }
      } else {
        std::cout << "(omitted, length: " << h.data.size() << ")" << std::endl;
      }
    } else if (it.first == lrit::AnnotationHeader::CODE) {
      auto h = file.getHeader<lrit::AnnotationHeader>();
      std::cout << "Annotation (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Text: "
                << h.text << std::endl;
    } else if (it.first == lrit::TimeStampHeader::CODE) {
      std::array<char, 128> tsbuf;
      auto h = file.getHeader<lrit::TimeStampHeader>();
      auto ts = h.getUnix();
      auto len = strftime(
        tsbuf.data(),
        tsbuf.size(),
        "%Y-%m-%d %H:%M:%S",
        gmtime(&ts.tv_sec));
      std::cout << "Time stamp (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Time stamp: "
                << std::string(tsbuf.data(), len) << std::endl;
    } else if (it.first == lrit::AncillaryTextHeader::CODE) {
      auto h = file.getHeader<lrit::AncillaryTextHeader>();
      std::cout << "Ancillary text (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Text: "
                << h.text << std::endl;
    } else if (it.first == lrit::SegmentIdentificationHeader::CODE) {
      auto h = file.getHeader<lrit::SegmentIdentificationHeader>();
      std::cout << "Segment identification (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Image identifier: "
                << h.imageIdentifier << std::endl;
      std::cout << "  Segment number: "
                << h.segmentNumber << std::endl;
      std::cout << "  Start column of segment: "
                << h.segmentStartColumn << std::endl;
      std::cout << "  Start line of segment: "
                << h.segmentStartLine << std::endl;
      std::cout << "  Number of segments: "
                << h.maxSegment << std::endl;
      std::cout << "  Width of final image: "
                << h.maxColumn << std::endl;
      std::cout << "  Height of final image: "
                << h.maxLine << std::endl;
    } else if (it.first == lrit::NOAALRITHeader::CODE) {
      auto h = file.getHeader<lrit::NOAALRITHeader>();
      std::cout << "NOAA LRIT (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Agency signature: "
                << std::string(h.agencySignature) << std::endl;
      std::cout << "  Product ID: "
                << h.productID << std::endl;
      std::cout << "  Product SubID: "
                << h.productSubID << std::endl;
      std::cout << "  Parameter: "
                << h.parameter << std::endl;
      std::cout << "  NOAA-specific compression: "
                << int(h.noaaSpecificCompression) << std::endl;
    } else if (it.first == lrit::HeaderStructureRecordHeader::CODE) {
      // Ignore...
    } else if (it.first == lrit::RiceCompressionHeader::CODE) {
      auto h = file.getHeader<lrit::RiceCompressionHeader>();
      std::cout << "Rice compression (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  Flags: "
                << h.flags << std::endl;
      std::cout << "  Pixels per block: "
                << int(h.pixelsPerBlock) << std::endl;
      std::cout << "  Scan lines per packet: "
                << int(h.scanLinesPerPacket) << std::endl;
    } else if (it.first == lrit::DCSFileNameHeader::CODE) {
      auto h = file.getHeader<lrit::DCSFileNameHeader>();
      std::cout << "DCS file name (" << decltype(h)::CODE << "):" << std::endl;
      std::cout << "  File name: " << h.fileName << std::endl;

    } else {
      std::cerr << "Header " << it.first << " not handled..." << std::endl;
      return 1;
    }
  }
  return 0;
}